

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::expression_is_constant_null(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRConstant *this_00;
  
  this_00 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,id);
  if (this_00 != (SPIRConstant *)0x0) {
    bVar1 = SPIRConstant::constant_is_null(this_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool CompilerGLSL::expression_is_constant_null(uint32_t id) const
{
	auto *c = maybe_get<SPIRConstant>(id);
	if (!c)
		return false;
	return c->constant_is_null();
}